

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surjection_impl.h
# Opt level: O2

void secp256k1_surjection_genmessage
               (uchar *msg32,secp256k1_generator *ephemeral_input_tags,size_t n_input_tags,
               secp256k1_generator *ephemeral_output_tag)

{
  bool bVar1;
  uchar pk_ser [33];
  secp256k1_sha256 local_98;
  
  local_98.s[0] = 0x6a09e667;
  local_98.s[1] = 0xbb67ae85;
  local_98.s[2] = 0x3c6ef372;
  local_98.s[3] = 0xa54ff53a;
  local_98.s[4] = 0x510e527f;
  local_98.s[5] = 0x9b05688c;
  local_98.s[6] = 0x1f83d9ab;
  local_98.s[7] = 0x5be0cd19;
  local_98.bytes = 0;
  while (bVar1 = n_input_tags != 0, n_input_tags = n_input_tags - 1, bVar1) {
    pk_ser[0] = ephemeral_input_tags->data[0x3f] & 1 | 2;
    pk_ser._1_8_ = *(undefined8 *)ephemeral_input_tags->data;
    pk_ser._9_8_ = *(undefined8 *)(ephemeral_input_tags->data + 8);
    pk_ser._17_8_ = *(undefined8 *)(ephemeral_input_tags->data + 0x10);
    pk_ser._25_8_ = *(undefined8 *)(ephemeral_input_tags->data + 0x18);
    secp256k1_sha256_write(&local_98,pk_ser,0x21);
    ephemeral_input_tags = ephemeral_input_tags + 1;
  }
  pk_ser[0] = ephemeral_output_tag->data[0x3f] & 1 | 2;
  pk_ser._1_8_ = *(undefined8 *)ephemeral_output_tag->data;
  pk_ser._9_8_ = *(undefined8 *)(ephemeral_output_tag->data + 8);
  pk_ser._17_8_ = *(undefined8 *)(ephemeral_output_tag->data + 0x10);
  pk_ser._25_8_ = *(undefined8 *)(ephemeral_output_tag->data + 0x18);
  secp256k1_sha256_write(&local_98,pk_ser,0x21);
  secp256k1_sha256_finalize(&local_98,msg32);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_surjection_genmessage(unsigned char *msg32, const secp256k1_generator *ephemeral_input_tags, size_t n_input_tags, const secp256k1_generator *ephemeral_output_tag) {
    /* compute message */
    size_t i;
    unsigned char pk_ser[33];
    size_t pk_len = sizeof(pk_ser);
    secp256k1_sha256 sha256_en;

    secp256k1_sha256_initialize(&sha256_en);
    for (i = 0; i < n_input_tags; i++) {
        pk_ser[0] = 2 + (ephemeral_input_tags[i].data[63] & 1);
        memcpy(&pk_ser[1], &ephemeral_input_tags[i].data[0], 32);
        secp256k1_sha256_write(&sha256_en, pk_ser, pk_len);
    }
    pk_ser[0] = 2 + (ephemeral_output_tag->data[63] & 1);
    memcpy(&pk_ser[1], &ephemeral_output_tag->data[0], 32);
    secp256k1_sha256_write(&sha256_en, pk_ser, pk_len);
    secp256k1_sha256_finalize(&sha256_en, msg32);
}